

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::AddInputCharacterUTF16(ImGuiIO *this,ImWchar16 c)

{
  unsigned_short local_18;
  unsigned_short local_16 [2];
  ImWchar16 local_12;
  ImWchar cp;
  ImGuiIO *pIStack_10;
  ImWchar16 c_local;
  ImGuiIO_conflict *this_local;
  
  if ((c != 0) || (this->InputQueueSurrogate != 0)) {
    local_12 = c;
    pIStack_10 = this;
    if ((c & 0xfc00) == 0xd800) {
      if (this->InputQueueSurrogate != 0) {
        local_16[1] = 0xfffd;
        ImVector<unsigned_short>::push_back
                  ((ImVector<unsigned_short> *)&this->InputQueueCharacters,local_16 + 1);
      }
      this->InputQueueSurrogate = local_12;
    }
    else {
      local_16[0] = c;
      if (this->InputQueueSurrogate != 0) {
        if ((c & 0xfc00) == 0xdc00) {
          local_16[0] = 0xfffd;
        }
        else {
          local_18 = 0xfffd;
          ImVector<unsigned_short>::push_back
                    ((ImVector<unsigned_short> *)&this->InputQueueCharacters,&local_18);
        }
        this->InputQueueSurrogate = 0;
      }
      ImVector<unsigned_short>::push_back
                ((ImVector<unsigned_short> *)&this->InputQueueCharacters,local_16);
    }
  }
  return;
}

Assistant:

void ImGuiIO::AddInputCharacterUTF16(ImWchar16 c)
{
    if (c == 0 && InputQueueSurrogate == 0)
        return;

    if ((c & 0xFC00) == 0xD800) // High surrogate, must save
    {
        if (InputQueueSurrogate != 0)
            InputQueueCharacters.push_back(IM_UNICODE_CODEPOINT_INVALID);
        InputQueueSurrogate = c;
        return;
    }

    ImWchar cp = c;
    if (InputQueueSurrogate != 0)
    {
        if ((c & 0xFC00) != 0xDC00) // Invalid low surrogate
        {
            InputQueueCharacters.push_back(IM_UNICODE_CODEPOINT_INVALID);
        }
        else
        {
#if IM_UNICODE_CODEPOINT_MAX == 0xFFFF
            cp = IM_UNICODE_CODEPOINT_INVALID; // Codepoint will not fit in ImWchar
#else
            cp = (ImWchar)(((InputQueueSurrogate - 0xD800) << 10) + (c - 0xDC00) + 0x10000);
#endif
        }

        InputQueueSurrogate = 0;
    }
    InputQueueCharacters.push_back(cp);
}